

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_keym_v1.cpp
# Opt level: O3

void __thiscall intel_keym_v1_t::_read(intel_keym_v1_t *this)

{
  km_hash_t *pkVar1;
  key_signature_t *pkVar2;
  kstream *pkVar3;
  byte bVar4;
  uint8_t uVar5;
  structure_ids_t sVar6;
  km_hash_t *this_00;
  key_signature_t *this_01;
  validation_not_equal_error<intel_keym_v1_t::structure_ids_t> *this_02;
  validation_expr_error<unsigned_char> *this_03;
  structure_ids_t local_70;
  structure_ids_t local_68;
  string local_60;
  string local_40;
  
  sVar6 = kaitai::kstream::read_u8le((this->super_kstruct).m__io);
  this->m_structure_id = sVar6;
  if (sVar6 != STRUCTURE_IDS_KEYM) {
    this_02 = (validation_not_equal_error<intel_keym_v1_t::structure_ids_t> *)
              __cxa_allocate_exception(0x48);
    local_70 = STRUCTURE_IDS_KEYM;
    local_68 = this->m_structure_id;
    pkVar3 = (this->super_kstruct).m__io;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"/seq/0","");
    kaitai::validation_not_equal_error<intel_keym_v1_t::structure_ids_t>::validation_not_equal_error
              (this_02,&local_70,&local_68,pkVar3,&local_40);
    __cxa_throw(this_02,&kaitai::validation_not_equal_error<intel_keym_v1_t::structure_ids_t>::
                         typeinfo,kaitai::kstruct_error::~kstruct_error);
  }
  bVar4 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_version = bVar4;
  if (bVar4 < 0x20) {
    uVar5 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_km_version = uVar5;
    uVar5 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_km_svn = uVar5;
    uVar5 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_km_id = uVar5;
    this_00 = (km_hash_t *)operator_new(0x48);
    km_hash_t::km_hash_t(this_00,(this->super_kstruct).m__io,this,this->m__root);
    pkVar1 = (this->m_km_hash)._M_t.
             super___uniq_ptr_impl<intel_keym_v1_t::km_hash_t,_std::default_delete<intel_keym_v1_t::km_hash_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_intel_keym_v1_t::km_hash_t_*,_std::default_delete<intel_keym_v1_t::km_hash_t>_>
             .super__Head_base<0UL,_intel_keym_v1_t::km_hash_t_*,_false>._M_head_impl;
    (this->m_km_hash)._M_t.
    super___uniq_ptr_impl<intel_keym_v1_t::km_hash_t,_std::default_delete<intel_keym_v1_t::km_hash_t>_>
    ._M_t.
    super__Tuple_impl<0UL,_intel_keym_v1_t::km_hash_t_*,_std::default_delete<intel_keym_v1_t::km_hash_t>_>
    .super__Head_base<0UL,_intel_keym_v1_t::km_hash_t_*,_false>._M_head_impl = this_00;
    if (pkVar1 != (km_hash_t *)0x0) {
      (**(code **)((long)(pkVar1->super_kstruct)._vptr_kstruct + 8))();
    }
    this_01 = (key_signature_t *)operator_new(0x40);
    key_signature_t::key_signature_t(this_01,(this->super_kstruct).m__io,this,this->m__root);
    pkVar2 = (this->m_key_signature)._M_t.
             super___uniq_ptr_impl<intel_keym_v1_t::key_signature_t,_std::default_delete<intel_keym_v1_t::key_signature_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_intel_keym_v1_t::key_signature_t_*,_std::default_delete<intel_keym_v1_t::key_signature_t>_>
             .super__Head_base<0UL,_intel_keym_v1_t::key_signature_t_*,_false>._M_head_impl;
    (this->m_key_signature)._M_t.
    super___uniq_ptr_impl<intel_keym_v1_t::key_signature_t,_std::default_delete<intel_keym_v1_t::key_signature_t>_>
    ._M_t.
    super__Tuple_impl<0UL,_intel_keym_v1_t::key_signature_t_*,_std::default_delete<intel_keym_v1_t::key_signature_t>_>
    .super__Head_base<0UL,_intel_keym_v1_t::key_signature_t_*,_false>._M_head_impl = this_01;
    if (pkVar2 != (key_signature_t *)0x0) {
      (**(code **)((long)(pkVar2->super_kstruct)._vptr_kstruct + 8))();
      return;
    }
    return;
  }
  this_03 = (validation_expr_error<unsigned_char> *)__cxa_allocate_exception(0x40);
  local_70 = CONCAT71(local_70._1_7_,this->m_version);
  pkVar3 = (this->super_kstruct).m__io;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"/seq/1","");
  kaitai::validation_expr_error<unsigned_char>::validation_expr_error
            (this_03,(uchar *)&local_70,pkVar3,&local_60);
  __cxa_throw(this_03,&kaitai::validation_expr_error<unsigned_char>::typeinfo,
              kaitai::kstruct_error::~kstruct_error);
}

Assistant:

void intel_keym_v1_t::_read() {
    m_structure_id = static_cast<intel_keym_v1_t::structure_ids_t>(m__io->read_u8le());
    if (!(structure_id() == intel_keym_v1_t::STRUCTURE_IDS_KEYM)) {
        throw kaitai::validation_not_equal_error<intel_keym_v1_t::structure_ids_t>(intel_keym_v1_t::STRUCTURE_IDS_KEYM, structure_id(), _io(), std::string("/seq/0"));
    }
    m_version = m__io->read_u1();
    {
        uint8_t _ = version();
        if (!(_ < 32)) {
            throw kaitai::validation_expr_error<uint8_t>(version(), _io(), std::string("/seq/1"));
        }
    }
    m_km_version = m__io->read_u1();
    m_km_svn = m__io->read_u1();
    m_km_id = m__io->read_u1();
    m_km_hash = std::unique_ptr<km_hash_t>(new km_hash_t(m__io, this, m__root));
    m_key_signature = std::unique_ptr<key_signature_t>(new key_signature_t(m__io, this, m__root));
}